

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O1

int KINGetNumLinConvFails(void *kinmem,long *nlcfails)

{
  int iVar1;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  KINLsMem local_18;
  KINMem local_10;
  
  iVar1 = kinLs_AccessLMem(kinmem,"KINGetNumLinConvFails",&local_10,&local_18);
  if (iVar1 == 0) {
    *nlcfails = local_18->ncfl;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINGetNumLinConvFails(void *kinmem, long int *nlcfails)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure; set output value and return */
  retval = kinLs_AccessLMem(kinmem, "KINGetNumLinConvFails",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);
  *nlcfails = kinls_mem->ncfl;
  return(KINLS_SUCCESS);
}